

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_unref_in_prepare_cb(void)

{
  uint uVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  ulong uVar5;
  long *plVar6;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  uv_prepare_t h;
  uv_timer_t uStack_198;
  uv_loop_t *puStack_120;
  long lStack_110;
  long lStack_108;
  uv_timer_t uStack_100;
  uv_loop_t *puStack_88;
  code *pcStack_80;
  long local_70;
  long local_68;
  uv_prepare_t local_60;
  
  pcStack_80 = (code *)0x1b54d0;
  puVar3 = uv_default_loop();
  pcStack_80 = (code *)0x1b54e0;
  uv_prepare_init(puVar3,&local_60);
  pcStack_80 = (code *)0x1b54ef;
  uv_prepare_start(&local_60,prepare_cb);
  pcStack_80 = (code *)0x1b54f4;
  puVar3 = uv_default_loop();
  pcStack_80 = (code *)0x1b54fe;
  uv_run(puVar3,UV_RUN_DEFAULT);
  pcStack_80 = (code *)0x1b5506;
  do_close(&local_60);
  pcStack_80 = (code *)0x1b550b;
  puVar3 = uv_default_loop();
  pcStack_80 = (code *)0x1b551f;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  pcStack_80 = (code *)0x1b5529;
  uv_run(puVar3,UV_RUN_DEFAULT);
  local_68 = 0;
  pcStack_80 = (code *)0x1b5537;
  puVar4 = uv_default_loop();
  pcStack_80 = (code *)0x1b553f;
  iVar2 = uv_loop_close(puVar4);
  local_70 = (long)iVar2;
  if (local_68 == local_70) {
    pcStack_80 = (code *)0x1b5557;
    uv_library_shutdown();
    return 0;
  }
  plVar6 = &local_68;
  pcStack_80 = prepare_cb;
  run_test_unref_in_prepare_cb_cold_1();
  if (plVar6 != (long *)0x0) {
    uVar1 = *(uint *)(plVar6 + 7);
    uVar5 = (ulong)uVar1;
    if ((uVar1 & 8) != 0) {
      *(uint *)(plVar6 + 7) = uVar1 & 0xfffffff7;
      uVar5 = (ulong)(uVar1 & 5);
      if ((uVar1 & 5) == 4) {
        uVar5 = plVar6[1];
        *(int *)(uVar5 + 8) = *(int *)(uVar5 + 8) + -1;
      }
    }
    return (int)uVar5;
  }
  puStack_88 = (uv_loop_t *)run_test_timer_ref;
  prepare_cb_cold_1();
  puStack_120 = (uv_loop_t *)0x1b558a;
  puStack_88 = puVar3;
  puVar3 = uv_default_loop();
  puStack_120 = (uv_loop_t *)0x1b559a;
  uv_timer_init(puVar3,&uStack_100);
  puStack_120 = (uv_loop_t *)0x1b55a2;
  uv_unref((uv_handle_t *)&uStack_100);
  puStack_120 = (uv_loop_t *)0x1b55a7;
  puVar3 = uv_default_loop();
  puStack_120 = (uv_loop_t *)0x1b55b1;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_120 = (uv_loop_t *)0x1b55b9;
  do_close(&uStack_100);
  puStack_120 = (uv_loop_t *)0x1b55be;
  puVar3 = uv_default_loop();
  puStack_120 = (uv_loop_t *)0x1b55d2;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_120 = (uv_loop_t *)0x1b55dc;
  uv_run(puVar3,UV_RUN_DEFAULT);
  lStack_108 = 0;
  puStack_120 = (uv_loop_t *)0x1b55ea;
  puVar4 = uv_default_loop();
  puStack_120 = (uv_loop_t *)0x1b55f2;
  iVar2 = uv_loop_close(puVar4);
  lStack_110 = (long)iVar2;
  if (lStack_108 == lStack_110) {
    puStack_120 = (uv_loop_t *)0x1b560a;
    uv_library_shutdown();
    return 0;
  }
  puStack_120 = (uv_loop_t *)run_test_timer_ref2;
  run_test_timer_ref_cold_1();
  puStack_120 = puVar3;
  puVar3 = uv_default_loop();
  uv_timer_init(puVar3,&uStack_198);
  uv_timer_start(&uStack_198,fail_cb,0x2a,0x2a);
  uv_unref((uv_handle_t *)&uStack_198);
  puVar3 = uv_default_loop();
  uv_run(puVar3,UV_RUN_DEFAULT);
  do_close(&uStack_198);
  puVar3 = uv_default_loop();
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  uv_run(puVar3,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_timer_ref2_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
          ,0x39,"fail_cb should not have been called",in_R9,puVar3);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(unref_in_prepare_cb) {
  uv_prepare_t h;
  uv_prepare_init(uv_default_loop(), &h);
  uv_prepare_start(&h, prepare_cb);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}